

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cpp
# Opt level: O1

void cppcms::impl::setup_logging(value *settings)

{
  undefined8 uVar1;
  bool bVar2;
  level_type lVar3;
  int iVar4;
  int iVar5;
  value *pvVar6;
  shared_ptr *psVar7;
  standard_error *this;
  runtime_error *this_00;
  pointer pbVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  string log_file;
  string facility;
  string sfacility;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vops;
  undefined1 local_f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [40];
  value *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  json::value::get_abi_cxx11_((string *)local_f8,settings,"logging.level","error");
  booster::log::logger::string_to_level((string *)local_f8);
  if ((standard_error *)local_f8._0_8_ != (standard_error *)(local_f8 + 0x10)) {
    operator_delete((void *)local_f8._0_8_);
  }
  lVar3 = booster::log::logger::instance();
  booster::log::logger::set_default_level(lVar3);
  pvVar6 = json::value::find(settings,"logging.file");
  bVar2 = json::value::is_undefined(pvVar6);
  if (bVar2) {
    pvVar6 = json::value::find(settings,"logging.syslog");
    bVar2 = json::value::is_undefined(pvVar6);
    if (!bVar2) goto LAB_001ba5bf;
    pvVar6 = json::value::find(settings,"logging.stderr");
    bVar2 = json::value::is_undefined(pvVar6);
    if (!bVar2) goto LAB_001ba5bf;
  }
  else {
LAB_001ba5bf:
    local_f8._0_8_ = local_f8._0_8_ & 0xffffffffffffff00;
    bVar2 = json::value::get<bool>(settings,"logging.stderr",(bool *)local_f8);
    if (!bVar2) goto LAB_001ba620;
  }
  psVar7 = (shared_ptr *)booster::log::logger::instance();
  this = (standard_error *)operator_new(0x10);
  booster::log::sinks::standard_error::standard_error(this);
  local_f8._0_8_ = this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<booster::log::sinks::standard_error*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8 + 8),this);
  booster::log::logger::add_sink(psVar7);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
  }
LAB_001ba620:
  local_f8._0_8_ = local_f8._0_8_ & 0xffffffffffffff00;
  bVar2 = json::value::get<bool>(settings,"logging.syslog.enable",(bool *)local_f8);
  if (bVar2) {
    json::value::get_abi_cxx11_((string *)local_f8,settings,"logging.syslog.id","");
    json::value::get_abi_cxx11_(&local_d8,settings,"logging.syslog.facility","user");
    local_98._0_8_ = (pointer)0x0;
    local_98._8_8_ = (pointer)0x0;
    local_98._16_8_ = (pointer)0x0;
    json::value::get<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_68,settings,"logging.syslog.options",
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_98);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_98);
    local_70 = settings;
    json::value::get_abi_cxx11_((string *)local_98,settings,"logging.syslog.options","");
    uVar12 = 0;
    if (local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar13 = 0;
      uVar11 = 1;
      uVar12 = 0;
      do {
        pbVar8 = local_68.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar13;
        iVar4 = std::__cxx11::string::compare((char *)pbVar8);
        if (iVar4 == 0) {
          uVar10 = 2;
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)pbVar8);
          if (iVar4 == 0) {
            uVar10 = 8;
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)pbVar8);
            if (iVar4 == 0) {
              uVar10 = 0x10;
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)pbVar8);
              if (iVar4 == 0) {
                uVar10 = 4;
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)pbVar8);
                if (iVar4 == 0) {
                  uVar10 = 0x20;
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)pbVar8);
                  uVar10 = (uint)(iVar4 == 0);
                }
              }
            }
          }
        }
        uVar12 = uVar12 | uVar10;
        uVar13 = (ulong)uVar11;
        uVar11 = uVar11 + 1;
      } while (uVar13 < (ulong)((long)local_68.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_68.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    iVar4 = 0;
    if (local_d8._M_string_length != 0) {
      iVar4 = std::__cxx11::string::compare((char *)&local_d8);
      if (iVar4 == 0) {
        iVar4 = 8;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&local_d8);
        if (iVar4 == 0) {
          iVar4 = 0x80;
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)&local_d8);
          if (iVar4 == 0) {
            iVar4 = 0x88;
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)&local_d8);
            if (iVar4 == 0) {
              iVar4 = 0x90;
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)&local_d8);
              if (iVar4 == 0) {
                iVar4 = 0x98;
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)&local_d8);
                if (iVar4 == 0) {
                  iVar4 = 0xa0;
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)&local_d8);
                  if (iVar4 == 0) {
                    iVar4 = 0xa8;
                  }
                  else {
                    iVar4 = std::__cxx11::string::compare((char *)&local_d8);
                    if (iVar4 == 0) {
                      iVar4 = 0xb0;
                    }
                    else {
                      iVar5 = std::__cxx11::string::compare((char *)&local_d8);
                      iVar4 = 0xb8;
                      if (iVar5 != 0) {
                        this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
                        std::operator+(&local_b8,"Unsupported syslog facility: ",&local_d8);
                        booster::runtime_error::runtime_error(this_00,&local_b8);
                        *(undefined ***)this_00 = &PTR__runtime_error_00287810;
                        (this_00->super_backtrace)._vptr_backtrace =
                             (_func_int **)&PTR__cppcms_error_00287838;
                        __cxa_throw(this_00,&cppcms_error::typeinfo,
                                    booster::runtime_error::~runtime_error);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      psVar7 = (shared_ptr *)booster::log::logger::instance();
      pbVar8 = (pointer)operator_new(0x10);
      settings = local_70;
      booster::log::sinks::syslog::syslog((syslog *)pbVar8,uVar12,iVar4);
      local_b8._M_dataplus._M_p = (pointer)pbVar8;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<booster::log::sinks::syslog*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8._M_string_length,
                 (syslog *)pbVar8);
      booster::log::logger::add_sink(psVar7);
    }
    else {
      psVar7 = (shared_ptr *)booster::log::logger::instance();
      pbVar8 = (pointer)operator_new(0x10);
      settings = local_70;
      booster::log::sinks::syslog::syslog((syslog *)pbVar8,(string *)local_f8,uVar12,iVar4);
      local_b8._M_dataplus._M_p = (pointer)pbVar8;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<booster::log::sinks::syslog*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8._M_string_length,
                 (syslog *)pbVar8);
      booster::log::logger::add_sink(psVar7);
    }
    if ((pointer)local_b8._M_string_length != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length);
    }
    if ((pointer)local_98._0_8_ != (pointer)(local_98 + 0x10)) {
      operator_delete((void *)local_98._0_8_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_d8._M_dataplus._M_p._4_4_,(uint)local_d8._M_dataplus._M_p) !=
        &local_d8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_d8._M_dataplus._M_p._4_4_,(uint)local_d8._M_dataplus._M_p));
    }
    if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
      operator_delete((void *)local_f8._0_8_);
    }
  }
  local_f8._8_8_ = 0;
  local_e8._M_local_buf[0] = '\0';
  local_f8._0_8_ = local_f8 + 0x10;
  json::value::get_abi_cxx11_(&local_d8,settings,"logging.file.name","");
  lVar9 = std::__cxx11::string::operator=((string *)local_f8,(string *)&local_d8);
  lVar9 = *(long *)(lVar9 + 8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_d8._M_dataplus._M_p._4_4_,(uint)local_d8._M_dataplus._M_p) !=
      &local_d8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_d8._M_dataplus._M_p._4_4_,(uint)local_d8._M_dataplus._M_p));
  }
  if (lVar9 != 0) {
    pbVar8 = (pointer)operator_new(0x30);
    booster::log::sinks::file::file((file *)pbVar8);
    local_98._0_8_ = pbVar8;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<booster::log::sinks::file*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8),(file *)pbVar8);
    local_d8._M_dataplus._M_p._0_4_ = 0;
    iVar4 = json::value::get<int>(settings,"logging.file.max_files",(int *)&local_d8);
    if (0 < iVar4) {
      booster::log::sinks::file::max_files((uint)local_98._0_8_);
    }
    local_d8._M_dataplus._M_p._0_4_ = (uint)local_d8._M_dataplus._M_p & 0xffffff00;
    bVar2 = json::value::get<bool>(settings,"logging.file.append",(bool *)&local_d8);
    if (bVar2) {
      booster::log::sinks::file::append();
    }
    uVar1 = local_98._0_8_;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,local_f8._0_8_,(pointer)(local_f8._0_8_ + local_f8._8_8_));
    booster::log::sinks::file::open(uVar1,local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    json::value::get_abi_cxx11_(&local_d8,settings,"logging.file.timezone","");
    booster::log::sinks::file::set_timezone((string *)local_98._0_8_);
    psVar7 = (shared_ptr *)booster::log::logger::instance();
    local_b8._M_dataplus._M_p = (pointer)local_98._0_8_;
    local_b8._M_string_length = local_98._8_8_;
    if ((pointer)local_98._8_8_ != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(local_98._8_8_ + 8) = (int)*(size_type *)(local_98._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(local_98._8_8_ + 8) = (int)*(size_type *)(local_98._8_8_ + 8) + 1;
      }
    }
    booster::log::logger::add_sink(psVar7);
    if ((pointer)local_b8._M_string_length != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_d8._M_dataplus._M_p._4_4_,(uint)local_d8._M_dataplus._M_p) !=
        &local_d8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_d8._M_dataplus._M_p._4_4_,(uint)local_d8._M_dataplus._M_p));
    }
    if ((pointer)local_98._8_8_ != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
    }
  }
  if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
    operator_delete((void *)local_f8._0_8_);
  }
  return;
}

Assistant:

void impl::setup_logging(json::value const &settings)
{
	using namespace booster::log;
	level_type level = logger::string_to_level(settings.get("logging.level","error"));
	logger::instance().set_default_level(level);
	if(	(
			settings.find("logging.file").is_undefined()
			&& settings.find("logging.syslog").is_undefined()
			&& settings.find("logging.stderr").is_undefined()
		)
		|| 
		settings.get("logging.stderr",false)==true
	  )
	{
		logger::instance().add_sink(booster::shared_ptr<sink>(new sinks::standard_error()));
	}
	if(settings.get("logging.syslog.enable",false)==true) {
		#ifndef CPPCMS_POSIX
			throw cppcms_error("Syslog is not availible on Windows");
		#else
		std::string id = settings.get("logging.syslog.id","");
		std::string facility = settings.get("logging.syslog.facility","user");
		std::vector<std::string> vops = settings.get("logging.syslog.options",std::vector<std::string>());
		std::string sfacility = settings.get("logging.syslog.options","");
		int facility_code = 0;
		int ops = 0;
		for(unsigned i=0;i<vops.size();i++) {
			std::string const &op=vops[i];
			if(op=="LOG_CONS") ops|=LOG_CONS;
			else if(op=="LOG_NDELAY") ops|=LOG_NDELAY;
			else if(op=="LOG_NOWAIT") ops|=LOG_NOWAIT;
			else if(op=="LOG_ODELAY") ops|=LOG_ODELAY;
			#ifdef LOG_PERROR
			else if(op=="LOG_PERROR") ops|=LOG_PERROR;
			#endif
			else if(op=="LOG_PID") ops|=LOG_PID;
		}
		if(!facility.empty()) {
			if(facility == "user") {
				facility_code = LOG_USER;
			} else if(facility == "local0") {
				facility_code = LOG_LOCAL0;
			} else if(facility == "local1") {
				facility_code = LOG_LOCAL1;
			} else if(facility == "local2") {
				facility_code = LOG_LOCAL2;
			} else if(facility == "local3") {
				facility_code = LOG_LOCAL3;
			} else if(facility == "local4") {
				facility_code = LOG_LOCAL4;
			} else if(facility == "local5") {
				facility_code = LOG_LOCAL5;
			} else if(facility == "local6") {
				facility_code = LOG_LOCAL6;
			} else if(facility == "local7") {
				facility_code = LOG_LOCAL7;
			} else {
				throw cppcms_error("Unsupported syslog facility: " + facility);
			}
		}
		if(id.empty())
			logger::instance().add_sink(booster::shared_ptr<sink>(new sinks::syslog(ops,facility_code)));
		else
			logger::instance().add_sink(booster::shared_ptr<sink>(new sinks::syslog(id,ops,facility_code)));
		#endif
	}

	std::string log_file;
	if(!(log_file=settings.get("logging.file.name","")).empty()) {
		booster::shared_ptr<sinks::file> file(new sinks::file());
		int max_files=0;
		if((max_files = settings.get("logging.file.max_files",0)) > 0)
			file->max_files(max_files);
		bool append = false;
		if((append = settings.get("logging.file.append",false))==true)
			file->append();
		file->open(log_file);
		std::string tz = settings.get("logging.file.timezone","");
		file->set_timezone(tz);
		logger::instance().add_sink(file);
	}
}